

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

void read_until_close_callback(void *context,cio_epoll_error error)

{
  cio_error cVar1;
  ssize_t sVar2;
  int *piVar3;
  uint8_t buffer [20];
  undefined1 auStack_28 [24];
  
  cVar1 = cio_linux_eventloop_unregister_read
                    (*(cio_eventloop **)((long)context + 200),
                     (cio_event_notifier *)((long)context + 0x68));
  if ((cVar1 == CIO_SUCCESS) && (error == CIO_EPOLL_SUCCESS)) {
    sVar2 = read(*(int *)((long)context + 0x80),auStack_28,0x14);
    if (sVar2 == 0) {
      cio_timer_cancel((cio_timer *)((long)context + 0x88));
      close_socket((cio_socket *)context);
      return;
    }
    if (sVar2 == -1) {
      piVar3 = __errno_location();
      if (*piVar3 != 0xb) goto LAB_00103210;
    }
    return;
  }
LAB_00103210:
  cancel_timer_and_reset_connection((cio_socket *)context);
  return;
}

Assistant:

static void read_until_close_callback(void *context, enum cio_epoll_error error)
{
	uint8_t buffer[READ_CLOSE_BUFFER_SIZE];

	struct cio_socket *socket = (struct cio_socket *)context;

	enum cio_error err = cio_linux_eventloop_unregister_read(socket->impl.loop, &socket->impl.ev);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		cancel_timer_and_reset_connection(socket);
		return;
	}

	if (cio_unlikely(error != CIO_EPOLL_SUCCESS)) {
		cancel_timer_and_reset_connection(socket);
		return;
	}

	ssize_t ret = read(socket->impl.ev.fd, buffer, sizeof(buffer));
	if (ret == -1) {
		if (cio_unlikely(errno != EAGAIN)) {
			cancel_timer_and_reset_connection(socket);
		}

		return;
	}

	if (ret == 0) {
		cio_timer_cancel(&socket->impl.close_timer);
		close_socket(socket);
	}
}